

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O3

int oss_parse_posix_tz(os_tzinfo_t *info,char *tz,size_t len,int west_is_positive)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *p;
  char *pcVar8;
  int iVar9;
  int dst_ofs;
  int std_ofs;
  os_tzrule_t dst_end;
  os_tzrule_t dst_start;
  int local_98;
  int local_94;
  size_t local_90;
  long local_88;
  char *local_80;
  ushort **local_78;
  os_tzinfo_t *local_70;
  os_tzrule_t local_68;
  os_tzrule_t local_48;
  
  local_94 = 0;
  local_98 = 0;
  local_48.jday = 0;
  local_48.yday = 0;
  local_48.month = 0;
  local_48.week = 0;
  local_48.day = 0;
  local_48.time = 0;
  local_68.jday = 0;
  local_68.yday = 0;
  local_68.month = 0;
  local_68.week = 0;
  local_68.day = 0;
  local_68.time = 0;
  if (len == 0 || tz == (char *)0x0) {
    return 0;
  }
  local_70 = info;
  local_78 = __ctype_b_loc();
  pcVar7 = tz;
  local_90 = len;
  pcVar8 = tz;
  while (uVar3 = (*local_78)[*pcVar8], (uVar3 >> 0xd & 1) != 0) {
    pcVar8 = pcVar8 + 1;
    pcVar7 = pcVar7 + 1;
    local_90 = local_90 - 1;
    if (local_90 == 0) {
      return 0;
    }
  }
  if ((uVar3 >> 10 & 1) == 0) {
    return 0;
  }
  p = pcVar8;
  do {
    if (local_90 == 1) {
      local_90 = 0;
      p = tz + len;
      break;
    }
    pcVar5 = p + 1;
    p = p + 1;
    local_90 = local_90 - 1;
  } while ((*(byte *)((long)*local_78 + (long)*pcVar5 * 2 + 1) & 4) != 0);
  local_80 = parse_offset(&local_94,p,&local_90);
  iVar9 = 0;
  if (local_80 == p) {
    return 0;
  }
  if (west_is_positive != 0) {
    local_94 = -local_94;
  }
  pcVar5 = local_80;
  if (local_90 == 0) {
LAB_001ece6d:
    local_98 = local_94;
    local_88 = 0;
    local_80 = (char *)0x0;
  }
  else {
    if (local_80 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else if ((*(byte *)((long)*local_78 + (long)*local_80 * 2 + 1) & 4) != 0) {
      pcVar4 = local_80 + local_90;
      do {
        if (local_90 == 1) {
          local_90 = 0;
          goto LAB_001ece85;
        }
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        local_90 = local_90 - 1;
      } while ((*(byte *)((long)*local_78 + (long)*pcVar1 * 2 + 1) & 4) != 0);
    }
    pcVar4 = pcVar5;
    if (pcVar5 == local_80) goto LAB_001ece6d;
LAB_001ece85:
    local_88 = (long)pcVar4 - (long)local_80;
    pcVar5 = parse_offset(&local_98,pcVar4,&local_90);
    if (pcVar5 == pcVar4) {
      local_98 = local_94 + 0xe10;
    }
    else if (west_is_positive != 0) {
      local_98 = -local_98;
    }
  }
  if (local_90 == 0) {
LAB_001ecf8e:
    pcVar5 = local_70->std_abbr;
    (local_70->dst_end).month = 0;
    (local_70->dst_end).week = 0;
    (local_70->dst_end).day = 0;
    (local_70->dst_end).time = 0;
    (local_70->dst_start).day = 0;
    (local_70->dst_start).time = 0;
    (local_70->dst_end).jday = 0;
    (local_70->dst_end).yday = 0;
    (local_70->dst_start).jday = 0;
    (local_70->dst_start).yday = 0;
    (local_70->dst_start).month = 0;
    (local_70->dst_start).week = 0;
    local_70->dst_abbr[0] = '\0';
    local_70->dst_abbr[1] = '\0';
    local_70->dst_abbr[2] = '\0';
    local_70->dst_abbr[3] = '\0';
    local_70->dst_abbr[4] = '\0';
    local_70->dst_abbr[5] = '\0';
    local_70->dst_abbr[6] = '\0';
    local_70->dst_abbr[7] = '\0';
    local_70->dst_abbr[8] = '\0';
    local_70->dst_abbr[9] = '\0';
    local_70->dst_abbr[10] = '\0';
    local_70->dst_abbr[0xb] = '\0';
    local_70->dst_abbr[0xc] = '\0';
    local_70->dst_abbr[0xd] = '\0';
    local_70->dst_abbr[0xe] = '\0';
    local_70->dst_abbr[0xf] = '\0';
    local_70->std_abbr[0] = '\0';
    local_70->std_abbr[1] = '\0';
    local_70->std_abbr[2] = '\0';
    local_70->std_abbr[3] = '\0';
    local_70->std_abbr[4] = '\0';
    local_70->std_abbr[5] = '\0';
    local_70->std_abbr[6] = '\0';
    local_70->std_abbr[7] = '\0';
    local_70->std_abbr[8] = '\0';
    local_70->std_abbr[9] = '\0';
    local_70->std_abbr[10] = '\0';
    local_70->std_abbr[0xb] = '\0';
    local_70->std_abbr[0xc] = '\0';
    local_70->std_abbr[0xd] = '\0';
    local_70->std_abbr[0xe] = '\0';
    local_70->std_abbr[0xf] = '\0';
    local_70->is_dst = 0;
    local_70->std_ofs = local_94;
    local_70->dst_ofs = local_98;
    if (p != pcVar7) {
      lVar6 = 0;
      do {
        if ((*(byte *)((long)*local_78 + (long)pcVar8[lVar6] * 2 + 1) & 4) == 0) break;
        pcVar5[lVar6] = pcVar8[lVar6];
        lVar6 = lVar6 + 1;
      } while ((long)p - (long)pcVar7 != lVar6);
      pcVar5 = pcVar5 + lVar6;
    }
    *pcVar5 = '\0';
    pcVar7 = local_70->dst_abbr;
    if ((local_88 != 0) && (local_80 != (char *)0x0)) {
      lVar6 = 0;
      do {
        if ((*(byte *)((long)*local_78 + (long)local_80[lVar6] * 2 + 1) & 4) == 0) break;
        pcVar7[lVar6] = local_80[lVar6];
        lVar6 = lVar6 + 1;
      } while (local_88 != lVar6);
      pcVar7 = pcVar7 + lVar6;
    }
    *pcVar7 = '\0';
    (local_70->dst_start).day = local_48.day;
    (local_70->dst_start).time = local_48.time;
    (local_70->dst_start).jday = local_48.jday;
    (local_70->dst_start).yday = local_48.yday;
    (local_70->dst_start).month = local_48.month;
    (local_70->dst_start).week = local_48.week;
    (local_70->dst_end).jday = local_68.jday;
    (local_70->dst_end).yday = local_68.yday;
    (local_70->dst_end).month = local_68.month;
    (local_70->dst_end).week = local_68.week;
    (local_70->dst_end).day = local_68.day;
    (local_70->dst_end).time = local_68.time;
    iVar9 = 1;
  }
  else {
    if (*pcVar5 == ',') {
      local_90 = local_90 - 1;
      pcVar4 = parse_dst_rule(&local_48,pcVar5 + 1,&local_90);
      if (pcVar4 == pcVar5 + 1) {
        return 0;
      }
      if (local_90 == 0) {
        return 0;
      }
      if (*pcVar4 != ',') {
        return 0;
      }
      local_90 = local_90 - 1;
      pcVar5 = parse_dst_rule(&local_68,pcVar4 + 1,&local_90);
      if (pcVar5 == pcVar4 + 1) {
        return 0;
      }
      if (local_90 == 0) goto LAB_001ecf8e;
    }
    do {
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while ((*(byte *)((long)*local_78 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  }
  return iVar9;
}

Assistant:

int oss_parse_posix_tz(struct os_tzinfo_t *info, const char *tz, size_t len,
                       int west_is_positive)
{
    const char *p;
    const char *std_name = 0, *dst_name = 0;
    size_t std_name_len = 0, dst_name_len = 0;
    int std_ofs = 0, dst_ofs = 0;
    struct os_tzrule_t dst_start, dst_end;

    /* clear the daylight savings start/end dates */
    memset(&dst_start, 0, sizeof(dst_start));
    memset(&dst_end, 0, sizeof(dst_end));

    /* if there's no TZ string, return failure */
    if (tz == 0)
        return FALSE;

    /* skip leading spaces, just in case; if that leaves nothing, fail */
    for ( ; len != 0 && isspace(*tz) ; ++tz, --len) ;
    if (len == 0)
        return FALSE;

    /* parse the standard time name; if that's empty, fail */
    std_name = tz;
    tz = parse_zone_name(0, 0, tz, &len);
    if ((std_name_len = tz - std_name) == 0)
        return FALSE;

    /* parse the offset value */
    p = tz;
    if ((tz = parse_offset(&std_ofs, tz, &len)) == p)
        return FALSE;

    /* if we're using west-positive notation, convert to os_tzinfo_t specs */
    if (west_is_positive)
        std_ofs = -std_ofs;

    /* if we're not done, check for a daylight zone */
    p = tz;
    if (len != 0 && (tz = parse_zone_name(0, 0, tz, &len)) != p)
    {
        /* found a daylight zone name - note it */
        dst_name = p;
        dst_name_len = tz - p;
        
        /* 
         *   check for an optional offset value; if it's not present,
         *   daylight time is implicitly one hour ahead of standard time 
         */
        p = tz;
        if ((tz = parse_offset(&dst_ofs, tz, &len)) == p)
            dst_ofs = std_ofs + 60*60;
        else if (west_is_positive)
            dst_ofs = -dst_ofs;
    }
    else
    {
        /* there's no daylight zone, so just repeat the standard offset */
        dst_ofs = std_ofs;
    }

    /* check for the daylight time start/end dates */
    if (len != 0 && *tz == ',')
    {
        /* parse the start date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_start, tz, &len)) == p)
            return FALSE;

        /* if there's a start date, there has to be an end date */
        if (len == 0 || *tz != ',')
            return FALSE;

        /* parse the end date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_end, tz, &len)) == p)
            return FALSE;
    }
    
    /* we need to be done now, other than trailing spaces */
    for ( ; len != 0 && isspace(*tz) ; ++tz) ;
    if (len != 0)
        return FALSE;

    /* clear the result structure */
    memset(info, 0, sizeof(*info));

    /* set the offsets */
    info->std_ofs = std_ofs;
    info->dst_ofs = dst_ofs;

    /* copy the abbreviation strings */
    parse_zone_name(info->std_abbr, sizeof(info->std_abbr),
                    std_name, &std_name_len);
    parse_zone_name(info->dst_abbr, sizeof(info->dst_abbr),
                    dst_name, &dst_name_len);

    /* copy the daylight start/end rules */
    memcpy(&info->dst_start, &dst_start, sizeof(info->dst_start));
    memcpy(&info->dst_end, &dst_end, sizeof(info->dst_end));

    /* success */
    return TRUE;
}